

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XorHandler.h
# Opt level: O1

int __thiscall TCLAP::XorHandler::check(XorHandler *this,Arg *a)

{
  Arg **ppAVar1;
  Arg *pAVar2;
  XorHandler *pXVar3;
  int iVar4;
  uint uVar5;
  ArgVectorIterator it;
  pointer pvVar6;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_> _Var7;
  Arg **ppAVar8;
  CmdLineParseException *this_00;
  ulong uVar9;
  ulong unaff_R12;
  Arg **ppAVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  Arg *local_80;
  XorHandler *local_78;
  string local_70;
  string local_50;
  
  uVar5 = (uint)unaff_R12;
  pvVar6 = (this->_orList).
           super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar12 = (this->_orList).
           super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish != pvVar6;
  local_80 = a;
  if (bVar12) {
    uVar11 = 0;
    local_78 = this;
    do {
      pXVar3 = local_78;
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<TCLAP::Arg**,std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>>,__gnu_cxx::__ops::_Iter_equals_val<TCLAP::Arg_const*const>>
                        (pvVar6[uVar11].
                         super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         pvVar6[uVar11].
                         super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_80);
      pvVar6 = (pXVar3->_orList).
               super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppAVar1 = pvVar6[uVar11].super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (_Var7._M_current != ppAVar1) {
        ppAVar8 = *(Arg ***)&pvVar6[uVar11].
                             super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl
        ;
        for (ppAVar10 = ppAVar8; ppAVar10 != ppAVar1; ppAVar10 = ppAVar10 + 1) {
          pAVar2 = *ppAVar10;
          if (((local_80 != pAVar2) && (pAVar2->_alreadySet == true)) && (pAVar2->_xorSet == false))
          {
            this_00 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_70,"Mutually exclusive argument already set!","");
            (*(*ppAVar10)->_vptr_Arg[7])(&local_50);
            CmdLineParseException::CmdLineParseException(this_00,&local_70,&local_50);
            __cxa_throw(this_00,&CmdLineParseException::typeinfo,ArgException::~ArgException);
          }
        }
        for (; ppAVar8 != ppAVar1; ppAVar8 = ppAVar8 + 1) {
          pAVar2 = *ppAVar8;
          if (local_80 != pAVar2) {
            pAVar2->_alreadySet = true;
            pAVar2->_xorSet = true;
          }
        }
        iVar4 = (*(*_Var7._M_current)->_vptr_Arg[0xb])();
        unaff_R12 = 0;
        if ((char)iVar4 == '\0') {
          pvVar6 = (local_78->_orList).
                   super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          unaff_R12 = (ulong)((long)pvVar6[uVar11].
                                    super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             *(long *)&pvVar6[uVar11].
                                       super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>
                                       ._M_impl) >> 3;
        }
      }
      uVar5 = (uint)unaff_R12;
      if (_Var7._M_current != ppAVar1) break;
      uVar11 = uVar11 + 1;
      pvVar6 = (local_78->_orList).
               super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar9 = ((long)(local_78->_orList).
                     super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 3) *
              -0x5555555555555555;
      bVar13 = uVar9 - uVar11 != 0;
      bVar12 = uVar11 <= uVar9 && bVar13;
    } while (uVar11 <= uVar9 && bVar13);
  }
  if (!bVar12) {
    uVar5 = (*local_80->_vptr_Arg[5])();
    uVar5 = uVar5 & 0xff;
  }
  return uVar5;
}

Assistant:

inline int XorHandler::check( const Arg* a ) 
{
	// iterate over each XOR list
	for ( int i = 0; static_cast<unsigned int>(i) < _orList.size(); i++ )
	{
		// if the XOR list contains the arg..
		ArgVectorIterator ait = std::find( _orList[i].begin(), 
		                                   _orList[i].end(), a );
		if ( ait != _orList[i].end() )
		{
			// first check to see if a mutually exclusive switch
			// has not already been set
			for ( ArgVectorIterator it = _orList[i].begin(); 
				  it != _orList[i].end(); 
				  it++ )
				if ( a != (*it) && (*it)->isSet() )
					throw(CmdLineParseException(
					      "Mutually exclusive argument already set!",
					      (*it)->toString()));

			// go through and set each arg that is not a
			for ( ArgVectorIterator it = _orList[i].begin(); 
				  it != _orList[i].end(); 
				  it++ )
				if ( a != (*it) )
					(*it)->xorSet();

			// return the number of required args that have now been set
			if ( (*ait)->allowMore() )
				return 0;
			else
				return static_cast<int>(_orList[i].size());
		}
	}

	if ( a->isRequired() )
		return 1;
	else
		return 0;
}